

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayType.cpp
# Opt level: O3

void __thiscall
hdc::ArrayType::ArrayType(ArrayType *this,Type *subtype,Expression *expression,Token *token)

{
  int iVar1;
  
  ASTNode::ASTNode((ASTNode *)this);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00196c20;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  this->subtype = subtype;
  this->expression = expression;
  iVar1 = token->line;
  (this->token).kind = token->kind;
  (this->token).line = iVar1;
  (this->token).column = token->column;
  std::__cxx11::string::_M_assign((string *)&(this->token).lexem);
  ASTNode::setKind((ASTNode *)this,AST_ARRAY_TYPE);
  return;
}

Assistant:

ArrayType::ArrayType(Type *subtype, Expression *expression, Token &token) {
    this->subtype = subtype;
    this->expression = expression;
    this->token = token;
    setKind(AST_ARRAY_TYPE);
}